

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O0

void move_chests(dw_rom *rom)

{
  uint8_t uVar1;
  bool bVar2;
  BOOL BVar3;
  uint8_t (*pauVar4) [3];
  dw_chest *pdVar5;
  uint8_t new_doors [9] [3];
  uint8_t chest_spots [78] [3];
  uint8_t chest_bins [4];
  uint8_t *new_door;
  uint8_t *chest_spot;
  int map;
  int bin;
  size_t j;
  size_t i;
  dw_rom *rom_local;
  
  chest_spots[0x4c][0] = '\x03';
  chest_spots[0x4c][1] = '\0';
  chest_spots[0x4c][2] = '\0';
  chest_spots[0x4d][0] = '\0';
  memcpy(new_doors + 8,&DAT_001eaf10,0xea);
  new_doors[0][0] = '\x02';
  new_doors[0][1] = '\v';
  new_doors[0][2] = '\x11';
  new_doors[1][0] = '\x15';
  new_doors[1][1] = '\x03';
  new_doors[1][2] = '\n';
  new_doors[2][0] = '\b';
  new_doors[2][1] = '\n';
  new_doors[2][2] = '\x03';
  new_doors[3][0] = '\x18';
  new_doors[3][1] = '\n';
  new_doors[3][2] = '\n';
  new_doors[4][0] = '\x04';
  new_doors[4][1] = '\x06';
  new_doors[4][2] = '\x04';
  new_doors[5][0] = '\t';
  new_doors[5][1] = '\x06';
  new_doors[5][2] = '\a';
  new_doors[6][0] = '\x16';
  if ((rom->flags[0] & 0x30) == 0) {
    return;
  }
  printf("Removing all chests...\n");
  for (j = 0; j < 0x4e; j = j + 1) {
    pauVar4 = new_doors + j + 8;
    BVar3 = is_dungeon_tileset((uint)(*pauVar4)[0]);
    if (BVar3 == FALSE) {
      set_dungeon_tile(rom,(uint)(*pauVar4)[0],new_doors[j + 8][1],new_doors[j + 8][2],'\x06');
    }
    else {
      set_dungeon_tile(rom,(uint)(*pauVar4)[0],new_doors[j + 8][1],new_doors[j + 8][2],'\x02');
    }
  }
  printf("Adding doors...\n");
  for (j = 0; j < 9; j = j + 1) {
    register0x00000000 = new_doors[j - 3] + 1;
    BVar3 = is_dungeon_tileset((uint)*register0x00000000);
    if (BVar3 == FALSE) {
      set_dungeon_tile(rom,(uint)*stack0xffffffffffffffc8,stack0xffffffffffffffc8[1],
                       stack0xffffffffffffffc8[2],'\v');
    }
    else {
      set_dungeon_tile(rom,(uint)*stack0xffffffffffffffc8,stack0xffffffffffffffc8[1],
                       stack0xffffffffffffffc8[2],'\x05');
    }
  }
  printf("Adding back chests...\n");
LAB_001cbe5b:
  mt_shuffle(new_doors + 8,0x4e,3);
  j = 0;
  _map = 0;
  do {
    if (0x1e < j) {
      return;
    }
    uVar1 = rom->chests[j].map;
    if ((uVar1 != '\x05') && (uVar1 != '\r')) {
      while (pdVar5 = chest_at(rom,new_doors[_map + 8][1],new_doors[_map + 8][2],j + 3),
            pdVar5 != (dw_chest *)0x0) {
        _map = _map + 1;
      }
      chest_spot._4_4_ = chest_bin((uint)new_doors[_map + 8][0]);
      while( true ) {
        bVar2 = false;
        if (-1 < chest_spot._4_4_) {
          bVar2 = 8 < chest_spots[0x4c][chest_spot._4_4_];
        }
        if (!bVar2) break;
        chest_spot._4_4_ = chest_bin((uint)new_doors[_map + 9][0]);
        _map = _map + 1;
      }
      if (0x4d < _map) break;
      if (-1 < chest_spot._4_4_) {
        chest_spots[0x4c][chest_spot._4_4_] = chest_spots[0x4c][chest_spot._4_4_] + '\x01';
      }
      rom->chests[j].map = new_doors[_map + 8][0];
      rom->chests[j].x = new_doors[_map + 8][1];
      rom->chests[j].y = new_doors[_map + 8][2];
      BVar3 = is_dungeon_tileset((uint)rom->chests[j].map);
      if (BVar3 == FALSE) {
        set_dungeon_tile(rom,(uint)rom->chests[j].map,rom->chests[j].x,rom->chests[j].y,'\x03');
      }
      else {
        set_dungeon_tile(rom,(uint)rom->chests[j].map,rom->chests[j].x,rom->chests[j].y,'\x04');
      }
    }
    j = j + 1;
    _map = _map + 1;
  } while( true );
  printf("Something went wrong, retrying chest placement...\n");
  chest_spots[0x4c][0] = '\x03';
  chest_spots[0x4c][1] = '\0';
  chest_spots[0x4c][2] = '\0';
  chest_spots[0x4d][0] = '\0';
  goto LAB_001cbe5b;
}

Assistant:

static void move_chests(dw_rom *rom)
{
    size_t i, j;
    int bin, map;
    uint8_t *chest_spot, *new_door;
    uint8_t chest_bins[4] = { 3, 0, 0, 0};
    uint8_t chest_spots[][3] = {
//         {TANTEGEL_THRONE_ROOM,  4,  4}, /* vanilla */
//         {TANTEGEL_THRONE_ROOM,  5,  4}, /* vanilla */
//         {TANTEGEL_THRONE_ROOM,  6,  1}, /* vanilla */
        {TANTEGEL,              1, 13}, /* vanilla */
        {TANTEGEL,              2, 13},
        {TANTEGEL,              3, 13}, /* vanilla */
        {TANTEGEL,              1, 14},
        {TANTEGEL,              2, 14}, /* vanilla */
        {TANTEGEL,              3, 14},
        {TANTEGEL,              1, 15}, /* vanilla */
        {TANTEGEL,              2, 15},
        {TANTEGEL,              3, 15}, /* vanilla */
        {TANTEGEL,             16, 15},
        {TANTEGEL,             24, 21},
        {TANTEGEL_BASEMENT,     4,  5}, /* vanilla */
        {TANTEGEL_BASEMENT,     4,  8},
        {TANTEGEL_BASEMENT,     5,  8},
        {BRECCONARY,            3, 21},
        {BRECCONARY,           10, 23},
//         {BRECCONARY,           21,  3},
        {ERDRICKS_CAVE,         9,  0},
        {ERDRICKS_CAVE_2,       1,  9},
        {ERDRICKS_CAVE_2,       9,  3}, /* vanilla */
        {GARINHAM,              4,  5},
        {GARINHAM,              8,  5}, /* vanilla */
        {GARINHAM,              8,  6}, /* vanilla */
        {GARINHAM,              9,  5}, /* vanilla */
        {GARINHAM,             18, 18},
        {GARINS_GRAVE_1,       11,  0}, /* vanilla */
        {GARINS_GRAVE_1,       12,  0}, /* vanilla */
        {GARINS_GRAVE_1,       13,  0}, /* vanilla */
        {GARINS_GRAVE_1,        0, 14},
        {GARINS_GRAVE_1,        7,  5},
        {GARINS_GRAVE_1,        4, 15},
        {GARINS_GRAVE_3,        1,  1}, /* vanilla */
        {GARINS_GRAVE_3,       13,  6}, /* vanilla */
        {GARINS_GRAVE_3,       13, 10},
        {GARINS_GRAVE_3,       17, 17},
        {KOL,                  22,  1},
        {KOL,                   3, 13},
        {SWAMP_CAVE,            5,  0},
        {SWAMP_CAVE,            4, 19},
        {SWAMP_CAVE,            5, 29},
        {RIMULDAR,             24, 23}, /* vanilla */
        {RIMULDAR,             17, 23},
        {RIMULDAR,              3, 20},
        {MOUNTAIN_CAVE,        13,  5}, /* vanilla */
        {MOUNTAIN_CAVE,        13,  9},
        {MOUNTAIN_CAVE_2,       1,  1},
        {MOUNTAIN_CAVE_2,      13,  9},
        {MOUNTAIN_CAVE_2,       0,  3},
        {MOUNTAIN_CAVE_2,       1,  6}, /* vanilla */
        {MOUNTAIN_CAVE_2,       2, 11},
        {MOUNTAIN_CAVE_2,       2,  2}, /* vanilla */
        {MOUNTAIN_CAVE_2,       3,  2}, /* vanilla */
        {MOUNTAIN_CAVE_2,      10,  9}, /* vanilla */
        {HAUKSNESS,             6,  9},
        {CANTLIN,               2, 27},
        {CANTLIN,              12,  2},
        {CHARLOCK_CAVE_1,      19,  9},
        {CHARLOCK_CAVE_1,       2, 17},
        {CHARLOCK_CAVE_1,       8,  6},
        {CHARLOCK_CAVE_1,      11,  6},
        {CHARLOCK_CAVE_1,      19,  6},
        {CHARLOCK_CAVE_2,       5,  5}, /* vanilla */
        {CHARLOCK_CAVE_3,       3,  8},
        {CHARLOCK_CAVE_4,       6,  4},
        {CHARLOCK_CAVE_5,       2,  0},
        {CHARLOCK_CAVE_6,       9,  0},
        {CHARLOCK_THRONE_ROOM,  5,  2},
        {CHARLOCK_THRONE_ROOM,  6, 12},
        {CHARLOCK_THRONE_ROOM,  8, 12},
        {CHARLOCK_THRONE_ROOM, 11, 11}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 11, 12}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 11, 13}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 12, 11},
        {CHARLOCK_THRONE_ROOM, 12, 12}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 12, 13}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 13, 11},
        {CHARLOCK_THRONE_ROOM, 13, 12},
        {CHARLOCK_THRONE_ROOM, 13, 13}, /* vanilla */
        {CHARLOCK_THRONE_ROOM, 22, 26},
    };

    uint8_t new_doors[][3] = {
        {BRECCONARY,            8, 23},
        {GARINHAM,             16, 18},
        {KOL,                  20,  2},
        {RIMULDAR,             17, 21},
        {HAUKSNESS,            10,  8},
        {CANTLIN,               3, 24},
        {CANTLIN,              10,  4},
        {CHARLOCK_THRONE_ROOM,  4,  9},
        {CHARLOCK_THRONE_ROOM,  7, 22},
    };

    if (!RANDOM_CHEST_LOCATIONS(rom)) {
        return;
    }

    printf("Removing all chests...\n");
    for (i=0; i < sizeof(chest_spots) / 3; i++) {
        chest_spot = chest_spots[i];
        if (is_dungeon_tileset(chest_spot[0])) {
            set_dungeon_tile(rom, chest_spot[0], chest_spot[1], chest_spot[2],
                    DUNGEON_TILE_BRICK);
        } else {
            set_dungeon_tile(rom, chest_spot[0], chest_spot[1], chest_spot[2],
                    TOWN_TILE_BRICK);
        }
    }
    printf("Adding doors...\n");
    for (i=0; i < sizeof(new_doors) / 3; i++) {
        new_door = new_doors[i];
        if (is_dungeon_tileset(new_door[0])) {
            set_dungeon_tile(rom, new_door[0], new_door[1], new_door[2],
                    DUNGEON_TILE_DOOR);
        } else {
            set_dungeon_tile(rom, new_door[0], new_door[1], new_door[2],
                    TOWN_TILE_DOOR);
        }
    }
    printf("Adding back chests...\n");
chest_placement_retry:
    mt_shuffle(chest_spots, sizeof(chest_spots) / 3, 3);
    for (i=0, j=0; i < CHEST_COUNT; i++, j++) {
        map = rom->chests[i].map;
         /* don't mess with these */
        if (map == TANTEGEL_THRONE_ROOM || map == NORTHERN_SHRINE)
            continue;
        while (chest_at(rom, chest_spots[j][1], chest_spots[j][2], i+3)) {
            j++;
        }
        bin = chest_bin(chest_spots[j][0]);
        while (bin >= 0 && chest_bins[bin] > 8) {
            bin = chest_bin(chest_spots[++j][0]);
        }
        if (j >= sizeof(chest_spots) / 3) {
            /* this should never happen, but just in case */
            printf("Something went wrong, retrying chest placement...\n");
            chest_bins[0] = 3;
            chest_bins[1] = chest_bins[2] = chest_bins[3] = 0;
            goto chest_placement_retry;
        }
        if (bin >= 0) {
            chest_bins[bin]++;
        }
        rom->chests[i].map = chest_spots[j][0];
        rom->chests[i].x = chest_spots[j][1];
        rom->chests[i].y = chest_spots[j][2];
        if (is_dungeon_tileset(rom->chests[i].map)) {
            set_dungeon_tile(rom, rom->chests[i].map, rom->chests[i].x,
                    rom->chests[i].y, DUNGEON_TILE_CHEST);
        } else {
            set_dungeon_tile(rom, rom->chests[i].map, rom->chests[i].x,
                    rom->chests[i].y, TOWN_TILE_CHEST);
        }
    }
}